

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall cmQtAutoMocUic::ParseCacheWrite(cmQtAutoMocUic *this)

{
  bool bVar1;
  BaseEvalT *pBVar2;
  Logger *pLVar3;
  BaseSettingsT *pBVar4;
  allocator<char> local_89;
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmQtAutoMocUic *local_18;
  cmQtAutoMocUic *this_local;
  
  local_18 = this;
  pBVar2 = BaseEval(this);
  if ((pBVar2->ParseCacheChanged & 1U) != 0) {
    pLVar3 = Log(this);
    bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar3);
    if (bVar1) {
      pLVar3 = Log(this);
      pBVar4 = BaseConst(this);
      cmQtAutoGen::Quoted(&local_58,&pBVar4->ParseCacheFile);
      std::operator+(&local_38,"Writing parse cache file ",&local_58);
      cmQtAutoGenerator::Logger::Info(pLVar3,GEN,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
    }
    pBVar2 = BaseEval(this);
    pBVar4 = BaseConst(this);
    bVar1 = ParseCacheT::WriteToFile(&pBVar2->ParseCache,&pBVar4->ParseCacheFile);
    if (!bVar1) {
      pLVar3 = Log(this);
      pBVar4 = BaseConst(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Parse cache file writing failed.",&local_89);
      cmQtAutoGenerator::Logger::ErrorFile(pLVar3,GEN,&pBVar4->ParseCacheFile,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      return false;
    }
  }
  return true;
}

Assistant:

bool cmQtAutoMocUic::ParseCacheWrite()
{
  if (BaseEval().ParseCacheChanged) {
    if (Log().Verbose()) {
      Log().Info(GenT::GEN,
                 "Writing parse cache file " +
                   Quoted(BaseConst().ParseCacheFile));
    }
    if (!BaseEval().ParseCache.WriteToFile(BaseConst().ParseCacheFile)) {
      Log().ErrorFile(GenT::GEN, BaseConst().ParseCacheFile,
                      "Parse cache file writing failed.");
      return false;
    }
  }
  return true;
}